

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.hpp
# Opt level: O2

SquareMatrix<double,_3> * __thiscall
OpenMD::Quaternion<double>::toRotationMatrix3
          (SquareMatrix<double,_3> *__return_storage_ptr__,Quaternion<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  SquareMatrix<double,_3>::SquareMatrix(__return_storage_ptr__);
  bVar4 = Vector<double,_4U>::isNormalized(&this->super_Vector<double,_4U>);
  if (!bVar4) {
    Vector<double,_4U>::normalize(&this->super_Vector<double,_4U>);
  }
  dVar6 = (this->super_Vector<double,_4U>).data_[0];
  dVar1 = (this->super_Vector<double,_4U>).data_[3];
  dVar2 = (this->super_Vector<double,_4U>).data_[1];
  dVar3 = (this->super_Vector<double,_4U>).data_[2];
  dVar10 = dVar1 * dVar1;
  dVar5 = dVar3 * dVar3;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][0] =
       ((dVar6 * dVar6 + dVar2 * dVar2) - dVar5) - dVar10;
  dVar8 = dVar2 * dVar3 + dVar6 * dVar1;
  dVar9 = dVar1 * dVar2 + -dVar6 * dVar3;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][1] = dVar8 + dVar8;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][2] = dVar9 + dVar9;
  dVar8 = dVar2 * dVar3 - dVar1 * dVar6;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][0] = dVar8 + dVar8;
  dVar7 = dVar6 * dVar6 - dVar2 * dVar2;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][1] = (dVar7 + dVar5) - dVar10;
  dVar8 = dVar1 * dVar3 + dVar6 * dVar2;
  dVar9 = dVar1 * dVar2 + dVar6 * dVar3;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][2] = dVar8 + dVar8;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][0] = dVar9 + dVar9;
  dVar6 = dVar3 * dVar1 - dVar2 * dVar6;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][1] = dVar6 + dVar6;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][2] = (dVar7 - dVar5) + dVar10;
  return __return_storage_ptr__;
}

Assistant:

SquareMatrix<Real, 3> toRotationMatrix3() {
      SquareMatrix<Real, 3> rotMat3;

      Real w2;
      Real x2;
      Real y2;
      Real z2;

      if (!this->isNormalized()) this->normalize();

      w2 = w() * w();
      x2 = x() * x();
      y2 = y() * y();
      z2 = z() * z();

      rotMat3(0, 0) = w2 + x2 - y2 - z2;
      rotMat3(0, 1) = 2.0 * (x() * y() + w() * z());
      rotMat3(0, 2) = 2.0 * (x() * z() - w() * y());

      rotMat3(1, 0) = 2.0 * (x() * y() - w() * z());
      rotMat3(1, 1) = w2 - x2 + y2 - z2;
      rotMat3(1, 2) = 2.0 * (y() * z() + w() * x());

      rotMat3(2, 0) = 2.0 * (x() * z() + w() * y());
      rotMat3(2, 1) = 2.0 * (y() * z() - w() * x());
      rotMat3(2, 2) = w2 - x2 - y2 + z2;

      return rotMat3;
    }